

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O0

bool IsLocalScope(ScopeData *scope)

{
  ScopeData *local_18;
  ScopeData *scope_local;
  
  if ((scope != (ScopeData *)0x0) && (local_18 = scope, scope->type != SCOPE_TEMPORARY)) {
    for (; local_18 != (ScopeData *)0x0; local_18 = local_18->scope) {
      if ((local_18->ownerFunction != (FunctionData *)0x0) ||
         (local_18->ownerType != (TypeBase *)0x0)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool IsLocalScope(ScopeData *scope)
{
	if(!scope)
		return false;

	if(scope->type == SCOPE_TEMPORARY)
		return false;

	// Not a global scope if there is an enclosing function or a type
	while(scope)
	{
		if(scope->ownerFunction || scope->ownerType)
			return true;

		scope = scope->scope;
	}

	return false;
}